

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O3

void __thiscall leveldb::LookupKey::LookupKey(LookupKey *this,Slice *user_key,SequenceNumber s)

{
  size_t __n;
  char *pcVar1;
  
  __n = user_key->size_;
  if (__n + 0xd < 0xc9) {
    pcVar1 = this->space_;
  }
  else {
    pcVar1 = (char *)operator_new__(__n + 0xd);
  }
  this->start_ = pcVar1;
  pcVar1 = EncodeVarint32(pcVar1,(int)__n + 8);
  this->kstart_ = pcVar1;
  memcpy(pcVar1,user_key->data_,__n);
  if (s >> 0x38 == 0) {
    pcVar1[__n] = '\x01';
    pcVar1[__n + 1] = (char)s;
    pcVar1[__n + 2] = (char)(s >> 8);
    pcVar1[__n + 3] = (char)(s >> 0x10);
    pcVar1[__n + 4] = (char)(s >> 0x18);
    pcVar1[__n + 5] = (char)(s >> 0x20);
    pcVar1[__n + 6] = (char)(s >> 0x28);
    pcVar1[__n + 7] = (char)(s >> 0x30);
    this->end_ = pcVar1 + __n + 8;
    return;
  }
  __assert_fail("seq <= kMaxSequenceNumber",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/dbformat.cc"
                ,0x10,"uint64_t leveldb::PackSequenceAndType(uint64_t, ValueType)");
}

Assistant:

LookupKey::LookupKey(const Slice& user_key, SequenceNumber s) {
  size_t usize = user_key.size();
  size_t needed = usize + 13;  // A conservative estimate
  char* dst;
  if (needed <= sizeof(space_)) {
    dst = space_;
  } else {
    dst = new char[needed];
  }
  start_ = dst;
  dst = EncodeVarint32(dst, usize + 8);
  kstart_ = dst;
  std::memcpy(dst, user_key.data(), usize);
  dst += usize;
  EncodeFixed64(dst, PackSequenceAndType(s, kValueTypeForSeek));
  dst += 8;
  end_ = dst;
}